

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

Relations dg::vr::ValueRelations::compare(C lt,C rt)

{
  uint uVar1;
  uint uVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  Relations result;
  int64_t isRt;
  int64_t isLt;
  _Base_bitset<1UL> local_8;
  
  uVar1 = llvm::ConstantInt::getBitWidth((ConstantInt *)0x208b38);
  if ((uVar1 == 1) || (uVar1 = llvm::ConstantInt::getBitWidth((ConstantInt *)0x208b47), uVar1 == 1))
  {
    uVar1 = llvm::ConstantInt::getBitWidth((ConstantInt *)0x208b56);
    uVar2 = llvm::ConstantInt::getBitWidth((ConstantInt *)0x208b64);
    if (uVar1 != uVar2) {
      memset(&local_8,0,8);
      Relations::Relations((Relations *)0x208b89);
      return (Relations)local_8._M_w;
    }
  }
  iVar3 = llvm::ConstantInt::getSExtValue((ConstantInt *)0x208b95);
  iVar4 = llvm::ConstantInt::getSExtValue((ConstantInt *)0x208ba4);
  Relations::Relations((Relations *)0x208bb3);
  if (iVar3 < iVar4) {
    Relations::slt((Relations *)0x208bc9);
  }
  else if (iVar4 < iVar3) {
    Relations::sgt((Relations *)0x208be1);
  }
  else {
    Relations::eq((Relations *)0x208bed);
  }
  lVar5 = dg::vr::Relations::addImplied();
  return (Relations)((_WordT)*(_Base_bitset<1UL> *)lVar5)._M_w;
}

Assistant:

Relations ValueRelations::compare(C lt, C rt) {
    // ignore bool values
    if ((lt->getBitWidth() == 1 || rt->getBitWidth() == 1) &&
        lt->getBitWidth() != rt->getBitWidth())
        return {};
    int64_t isLt = lt->getSExtValue();
    int64_t isRt = rt->getSExtValue();
    Relations result;
    if (isLt < isRt)
        result.slt();
    else if (isLt > isRt)
        result.sgt();
    else
        result.eq();

    // possible to collect unsigned relations between constants here

    return result.addImplied();
}